

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_blockhash.cpp
# Opt level: O2

void __thiscall BlockHash_Constractor_hex_Test::TestBody(BlockHash_Constractor_hex_Test *this)

{
  bool bVar1;
  char *pcVar2;
  string local_80;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  BlockHash blockhash;
  int local_14;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_80,"",(allocator *)&gtest_ar);
    cfd::core::BlockHash::BlockHash(&blockhash,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    cfd::core::BlockHash::~BlockHash(&blockhash);
  }
  testing::Message::Message((Message *)&blockhash);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_blockhash.cpp"
             ,0x11,
             "Expected: BlockHash blockhash(\"\") throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&blockhash);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&blockhash);
  std::__cxx11::string::string
            ((string *)&local_80,"3412907856341290785634129078563412907856341290785634129078563412",
             (allocator *)&gtest_ar);
  cfd::core::BlockHash::BlockHash(&blockhash,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  cfd::core::BlockHash::GetHex_abi_cxx11_(&local_80,&blockhash);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"blockhash.GetHex().c_str()",
             "\"3412907856341290785634129078563412907856341290785634129078563412\"",
             local_80._M_dataplus._M_p,
             "3412907856341290785634129078563412907856341290785634129078563412");
  std::__cxx11::string::~string((string *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_blockhash.cpp"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::BlockHash::GetData((ByteData *)&local_80,&blockhash);
  gtest_ar_2._0_8_ = cfd::core::ByteData::GetDataSize((ByteData *)&local_80);
  local_14 = 0x20;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"blockhash.GetData().GetDataSize()","32",
             (unsigned_long *)&gtest_ar_2,&local_14);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_blockhash.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::BlockHash::GetData((ByteData *)&gtest_ar,&blockhash);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_80,(ByteData *)&gtest_ar);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"blockhash.GetData().GetHex().c_str()",
             "\"1234567890123456789012345678901234567890123456789012345678901234\"",
             local_80._M_dataplus._M_p,
             "1234567890123456789012345678901234567890123456789012345678901234");
  std::__cxx11::string::~string((string *)&local_80);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_blockhash.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::BlockHash::~BlockHash(&blockhash);
  return;
}

Assistant:

TEST(BlockHash, Constractor_hex) {
  // empty
  EXPECT_THROW(BlockHash blockhash(""), CfdException);

  BlockHash blockhash(
      "3412907856341290785634129078563412907856341290785634129078563412");
  EXPECT_STREQ(
      blockhash.GetHex().c_str(),
      "3412907856341290785634129078563412907856341290785634129078563412");
  EXPECT_EQ(blockhash.GetData().GetDataSize(), 32);
  EXPECT_STREQ(
      blockhash.GetData().GetHex().c_str(),
      "1234567890123456789012345678901234567890123456789012345678901234");
}